

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void CVmObjTads::set_sc_cb(vm_obj_id_t obj,void *ctx0)

{
  vm_tadsobj_hdr *this;
  vm_obj_id_t *pvVar1;
  int iVar2;
  tadsobj_objid_and_ptr *ptVar3;
  
  iVar2 = is_tadsobj_obj(obj);
  if (iVar2 != 0) {
    this = *(vm_tadsobj_hdr **)((long)&G_obj_table_X.pages_[obj >> 0xc][obj & 0xfff].ptr_ + 8);
    ptVar3 = this->inh_path;
    if (ptVar3 != (tadsobj_objid_and_ptr *)0x0) {
      while (pvVar1 = &ptVar3->id, *pvVar1 != 0) {
        ptVar3 = ptVar3 + 1;
        if (*pvVar1 == *ctx0) {
          vm_tadsobj_hdr::inval_inh_path(this);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void CVmObjTads::set_sc_cb(VMG_ vm_obj_id_t obj, void *ctx0)
{
    /* if this is a TadsObject instance, update it */
    if (CVmObjTads::is_tadsobj_obj(vmg_ obj))
    {
        /* cast the context to our private structure */
        set_sc_cb_ctx *ctx = (set_sc_cb_ctx *)ctx0;

        /* get this object's header */
        vm_tadsobj_hdr *hdr = ((CVmObjTads *)vm_objp(vmg_ obj))->get_hdr();
        
        /* 
         *   if it has a cached inheritance path, check to see if it contains
         *   the object being changed 
         */
        tadsobj_objid_and_ptr *path = hdr->inh_path;
        if (path != 0)
        {
            /* scan the path for 'obj' */
            for ( ; path->id != VM_INVALID_OBJ ; ++path)
            {
                /* if this superclass is 'obj', we must delete the path */
                if (path->id == ctx->obj)
                {
                    /* we need to drop this path */
                    hdr->inval_inh_path();
                    
                    /* no need to look any further */
                    break;
                }
            }
        }
    }